

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_wad.c
# Opt level: O0

void * WAD_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  int iVar1;
  void *unpkarc;
  PHYSFS_uint32 local_38;
  PHYSFS_uint32 directoryOffset;
  PHYSFS_uint32 count;
  PHYSFS_uint8 buf [4];
  int *claimed_local;
  int forWriting_local;
  char *name_local;
  PHYSFS_Io *io_local;
  
  _count = claimed;
  if (io == (PHYSFS_Io *)0x0) {
    __assert_fail("io != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/icculus[P]physfs/src/physfs_archiver_wad.c"
                  ,0x51,"void *WAD_openArchive(PHYSFS_Io *, const char *, int, int *)");
  }
  if (forWriting == 0) {
    iVar1 = __PHYSFS_readAll(io,&directoryOffset,4);
    if (iVar1 == 0) {
      io_local = (PHYSFS_Io *)0x0;
    }
    else if ((directoryOffset == 0x44415749) || (directoryOffset == 0x44415750)) {
      *_count = 1;
      iVar1 = __PHYSFS_readAll(io,&local_38,4);
      if (iVar1 == 0) {
        io_local = (PHYSFS_Io *)0x0;
      }
      else {
        local_38 = PHYSFS_swapULE32(local_38);
        iVar1 = __PHYSFS_readAll(io,(void *)((long)&unpkarc + 4),4);
        if (iVar1 == 0) {
          io_local = (PHYSFS_Io *)0x0;
        }
        else {
          unpkarc._4_4_ = PHYSFS_swapULE32(unpkarc._4_4_);
          iVar1 = (*io->seek)(io,(ulong)unpkarc._4_4_);
          if (iVar1 == 0) {
            io_local = (PHYSFS_Io *)0x0;
          }
          else {
            io_local = (PHYSFS_Io *)UNPK_openArchive(io,0,1);
            if (io_local == (PHYSFS_Io *)0x0) {
              io_local = (PHYSFS_Io *)0x0;
            }
            else {
              iVar1 = wadLoadEntries(io,local_38,io_local);
              if (iVar1 == 0) {
                UNPK_abandonArchive(io_local);
                io_local = (PHYSFS_Io *)0x0;
              }
            }
          }
        }
      }
    }
    else {
      PHYSFS_setErrorCode(PHYSFS_ERR_UNSUPPORTED);
      io_local = (PHYSFS_Io *)0x0;
    }
  }
  else {
    PHYSFS_setErrorCode(PHYSFS_ERR_READ_ONLY);
    io_local = (PHYSFS_Io *)0x0;
  }
  return io_local;
}

Assistant:

static void *WAD_openArchive(PHYSFS_Io *io, const char *name,
                             int forWriting, int *claimed)
{
    PHYSFS_uint8 buf[4];
    PHYSFS_uint32 count;
    PHYSFS_uint32 directoryOffset;
    void *unpkarc;

    assert(io != NULL);  /* shouldn't ever happen. */

    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);
    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, buf, sizeof (buf)), NULL);
    if ((memcmp(buf, "IWAD", 4) != 0) && (memcmp(buf, "PWAD", 4) != 0))
        BAIL(PHYSFS_ERR_UNSUPPORTED, NULL);

    *claimed = 1;

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &count, sizeof (count)), NULL);
    count = PHYSFS_swapULE32(count);

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &directoryOffset, 4), 0);
    directoryOffset = PHYSFS_swapULE32(directoryOffset);

    BAIL_IF_ERRPASS(!io->seek(io, directoryOffset), 0);

    unpkarc = UNPK_openArchive(io, 0, 1);
    BAIL_IF_ERRPASS(!unpkarc, NULL);

    if (!wadLoadEntries(io, count, unpkarc))
    {
        UNPK_abandonArchive(unpkarc);
        return NULL;
    } /* if */

    return unpkarc;
}